

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ReportError
          (ParserImpl *this,int line,int col,string_view message)

{
  ErrorCollector *pEVar1;
  char *pcVar2;
  LogMessage *pLVar3;
  string_view v;
  string_view v_00;
  LogMessage local_40;
  
  this->had_errors_ = true;
  pEVar1 = this->error_collector_;
  if (pEVar1 != (ErrorCollector *)0x0) {
    (*pEVar1->_vptr_ErrorCollector[2])
              (pEVar1,(ulong)(uint)line,(ulong)(uint)col,message._M_len,message._M_str);
    return;
  }
  if (line < 0) {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
               ,0x17e);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (&local_40,(char (*) [27])"Error parsing text-format ");
    pcVar2 = (this->root_message_type_->all_names_).payload_;
    v_00._M_len = (ulong)*(ushort *)(pcVar2 + 2);
    v_00._M_str = pcVar2 + ~v_00._M_len;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,v_00);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar3,(char (*) [3])0x10f1c82);
    absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,message);
  }
  else {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
               ,0x17a);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (&local_40,(char (*) [27])"Error parsing text-format ");
    pcVar2 = (this->root_message_type_->all_names_).payload_;
    v._M_len = (ulong)*(ushort *)(pcVar2 + 2);
    v._M_str = pcVar2 + ~v._M_len;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,v);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar3,(char (*) [3])0x10f1c82);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,line + 1);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,(char (*) [2])0xd5a2aa)
    ;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,col + 1);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar3,(char (*) [3])0x10f1c82);
    absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,message);
  }
  absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_40);
  return;
}

Assistant:

void ReportError(int line, int col, absl::string_view message) {
    had_errors_ = true;
    if (error_collector_ == nullptr) {
      if (line >= 0) {
        ABSL_LOG(ERROR) << "Error parsing text-format "
                        << root_message_type_->full_name() << ": " << (line + 1)
                        << ":" << (col + 1) << ": " << message;
      } else {
        ABSL_LOG(ERROR) << "Error parsing text-format "
                        << root_message_type_->full_name() << ": " << message;
      }
    } else {
      error_collector_->RecordError(line, col, message);
    }
  }